

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

MPP_RET mpp_enc_get_pskip_mode(Mpp *mpp,EncAsyncTaskInfo *task,MppPskipMode *skip_mode)

{
  MppEnc pvVar1;
  RK_S32 RVar2;
  EncFrmStatus *pEVar3;
  MppMeta meta;
  MppMeta frm_meta;
  MPP_RET ret;
  HalEncTask *hal_task;
  EncFrmStatus *frm;
  EncRcTask *rc_task;
  MppEncImpl *enc;
  MppPskipMode *skip_mode_local;
  EncAsyncTaskInfo *task_local;
  Mpp *mpp_local;
  
  pvVar1 = mpp->mEnc;
  pEVar3 = &(task->rc).frm;
  skip_mode->pskip_is_ref = 0;
  skip_mode->pskip_is_non_ref = 0;
  *(MppFrame *)((long)pvVar1 + 0x98) = (task->task).frame;
  RVar2 = mpp_frame_has_meta(*(MppFrame *)((long)pvVar1 + 0x98));
  if ((RVar2 != 0) &&
     (meta = mpp_frame_get_meta(*(MppFrame *)((long)pvVar1 + 0x98)), meta != (MppMeta)0x0)) {
    mpp_meta_get_s32(meta,KEY_INPUT_PSKIP,&skip_mode->pskip_is_ref);
    mpp_meta_get_s32(meta,KEY_INPUT_PSKIP_NON_REF,&skip_mode->pskip_is_non_ref);
  }
  if ((skip_mode->pskip_is_ref == 1) && (skip_mode->pskip_is_non_ref == 1)) {
    _mpp_log_l(2,"mpp_enc",
               "task %d, Don\'t cfg pskip frame to be both a ref and non-ref at the same time",
               (char *)0x0);
    frm_meta._4_4_ = MPP_NOK;
  }
  else {
    pEVar3->val = pEVar3->val & 0xffffffefffffffff |
                  ((ulong)(uint)skip_mode->pskip_is_non_ref & 1) << 0x24;
    pEVar3->val = pEVar3->val & 0xffffffdfffffffff |
                  ((ulong)(uint)skip_mode->pskip_is_ref & 1) << 0x25;
    frm_meta._4_4_ = MPP_OK;
  }
  return frm_meta._4_4_;
}

Assistant:

static MPP_RET mpp_enc_get_pskip_mode(Mpp *mpp, EncAsyncTaskInfo *task, MppPskipMode *skip_mode)
{
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    EncRcTask *rc_task = &task->rc;
    EncFrmStatus *frm = &rc_task->frm;
    HalEncTask *hal_task = &task->task;
    MPP_RET ret = MPP_OK;

    skip_mode->pskip_is_ref = 0;
    skip_mode->pskip_is_non_ref = 0;
    enc->frame = hal_task->frame;

    if (mpp_frame_has_meta(enc->frame)) {
        MppMeta frm_meta = mpp_frame_get_meta(enc->frame);
        if (frm_meta) {
            mpp_meta_get_s32(frm_meta, KEY_INPUT_PSKIP, &skip_mode->pskip_is_ref);
            mpp_meta_get_s32(frm_meta, KEY_INPUT_PSKIP_NON_REF, &skip_mode->pskip_is_non_ref);
        }
    }

    if (skip_mode->pskip_is_ref == 1 && skip_mode->pskip_is_non_ref == 1) {
        mpp_err("task %d, Don't cfg pskip frame to be both a ref and non-ref at the same time");
        ret = MPP_NOK;
    } else {
        frm->force_pskip = skip_mode->pskip_is_non_ref;
        frm->force_pskip_is_ref = skip_mode->pskip_is_ref;
        ret = MPP_OK;
    }

    return ret;
}